

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readxm.c
# Opt level: O2

int limit_xm_resize(void *f,long n)

{
  undefined8 *puVar1;
  int32 iVar2;
  char *ptr;
  
  puVar1 = *(undefined8 **)((long)f + 8);
  ptr = (char *)*puVar1;
  if (n == 0 && ptr == (char *)0x0) {
    *puVar1 = 0;
    puVar1[3] = 0;
  }
  else {
    if ((long)puVar1[3] < n) {
      ptr = (char *)realloc(ptr,n);
      if (ptr == (char *)0x0) {
        return -1;
      }
      *puVar1 = ptr;
      memset(ptr + puVar1[3],0,n - puVar1[3]);
      puVar1[3] = n;
    }
    iVar2 = dumbfile_getnc(ptr,(int32)n,(DUMBFILE *)puVar1[4]);
    if (iVar2 < n) {
      return -1;
    }
  }
  puVar1[2] = n;
  puVar1[1] = 0;
  return 0;
}

Assistant:

static int DUMBCALLBACK limit_xm_resize(void *f, long n)
{
	DUMBFILE *df = f;
	LIMITED_XM *lx = df->file;
	if (lx->buffered || n) {
		if (n > lx->allocated) {
			unsigned char *buffered = realloc( lx->buffered, n );
			if ( !buffered ) return -1;
			lx->buffered = buffered;
			memset( buffered + lx->allocated, 0, n - lx->allocated );
			lx->allocated = n;
		}
        if ( dumbfile_getnc( (char *)lx->buffered, n, lx->remaining ) < n ) return -1;
	} else if (!n) {
		if ( lx->buffered ) free( lx->buffered );
		lx->buffered = NULL;
		lx->allocated = 0;
	}
	lx->limit = n;
	lx->ptr = 0;
	return 0;
}